

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

CompoundString *
Js::CompoundString::NewWithCharCapacity(CharCount initialCharCapacity,JavascriptLibrary *library)

{
  bool bVar1;
  uint uVar2;
  uint initialBlockSize;
  CompoundString *pCVar3;
  uint charCapacity;
  
  uVar2 = initialCharCapacity + (initialCharCapacity == 0);
  charCapacity = uVar2 + 7 & 0xfffffff8;
  if (charCapacity < uVar2) {
    ::Math::DefaultOverflowPolicy();
  }
  bVar1 = BlockInfo::ShouldAllocateBuffer(charCapacity);
  if (bVar1) {
    pCVar3 = NewWithBufferCharCapacity(charCapacity,library);
    return pCVar3;
  }
  initialBlockSize = Block::SizeFromUsedCharLength(initialCharCapacity);
  pCVar3 = NewWithBlockSize(initialBlockSize,library);
  return pCVar3;
}

Assistant:

CompoundString *CompoundString::NewWithCharCapacity(
        const CharCount initialCharCapacity,
        JavascriptLibrary *const library)
    {
        const CharCount alignedInitialCharCapacity = BlockInfo::AlignCharCapacityForAllocation(initialCharCapacity);
        if(BlockInfo::ShouldAllocateBuffer(alignedInitialCharCapacity))
            return NewWithBufferCharCapacity(alignedInitialCharCapacity, library);
        return NewWithBlockSize(Block::SizeFromUsedCharLength(initialCharCapacity), library);
    }